

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::TestRepeatedScalarDifferentTagSizes::Clear
          (TestRepeatedScalarDifferentTagSizes *this)

{
  anon_union_104_1_493b367e_for_TestRepeatedScalarDifferentTagSizes_3 *this_00;
  RepeatedField<int> *this_01;
  RepeatedField<unsigned_long> *pRVar1;
  RepeatedField<long> *this_02;
  RepeatedField<float> *this_03;
  ulong uVar2;
  anon_union_104_1_493b367e_for_TestRepeatedScalarDifferentTagSizes_3 aVar3;
  int iVar4;
  bool bVar5;
  
  this_00 = &this->field_0;
  aVar3 = this->field_0;
  if (((undefined1  [104])aVar3 & (undefined1  [104])0x4) != (undefined1  [104])0x0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)&this_00->_impl_);
  }
  bVar5 = ((undefined1  [104])aVar3 & (undefined1  [104])0x4) == (undefined1  [104])0x0;
  google::protobuf::internal::SooRep::size((SooRep *)&this_00->_impl_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size((SooRep *)&this_00->_impl_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [104])((undefined1  [104])*this_00 & (undefined1  [104])0x4) !=
      (undefined1  [104])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)&this_00->_impl_);
  }
  google::protobuf::RepeatedField<unsigned_int>::set_size
            (&(this_00->_impl_).repeated_fixed32_,
             ((undefined1  [104])aVar3 & (undefined1  [104])0x4) == (undefined1  [104])0x0,0);
  this_01 = &(this->field_0)._impl_.repeated_int32_;
  aVar3 = this->field_0;
  if (((undefined1  [104])aVar3 & (undefined1  [104])0x4) != (undefined1  [104])0x0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_01);
  }
  bVar5 = ((undefined1  [104])aVar3 & (undefined1  [104])0x4) == (undefined1  [104])0x0;
  google::protobuf::internal::SooRep::size(&this_01->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&this_01->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_01);
  }
  google::protobuf::RepeatedField<int>::set_size
            (this_01,((undefined1  [104])aVar3 & (undefined1  [104])0x4) == (undefined1  [104])0x0,0
            );
  pRVar1 = &(this->field_0)._impl_.repeated_fixed64_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x20);
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar2 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<unsigned_long>::set_size(pRVar1,(uVar2 & 4) == 0,0);
  this_02 = &(this->field_0)._impl_.repeated_int64_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x30);
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_02);
  }
  bVar5 = (uVar2 & 4) == 0;
  google::protobuf::internal::SooRep::size(&this_02->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&this_02->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_02->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_02);
  }
  google::protobuf::RepeatedField<long>::set_size(this_02,(uVar2 & 4) == 0,0);
  this_03 = &(this->field_0)._impl_.repeated_float_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x40);
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_03);
  }
  bVar5 = (uVar2 & 4) == 0;
  google::protobuf::internal::SooRep::size(&this_03->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&this_03->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_03->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_03);
  }
  google::protobuf::RepeatedField<float>::set_size(this_03,(uVar2 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_uint64_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x50);
  if ((uVar2 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar2 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<unsigned_long>::set_size(pRVar1,(uVar2 & 4) == 0,0);
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestRepeatedScalarDifferentTagSizes::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestRepeatedScalarDifferentTagSizes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_fixed32_.Clear();
  _impl_.repeated_int32_.Clear();
  _impl_.repeated_fixed64_.Clear();
  _impl_.repeated_int64_.Clear();
  _impl_.repeated_float_.Clear();
  _impl_.repeated_uint64_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}